

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O0

void __thiscall TextField::setString(TextField *this,string *s)

{
  int *piVar1;
  ulong in_RSI;
  long in_RDI;
  Vector2f VVar2;
  String *in_stack_ffffffffffffff58;
  Text *in_stack_ffffffffffffff60;
  float local_70;
  int local_68 [2];
  locale *in_stack_ffffffffffffffa0;
  Text *in_stack_ffffffffffffffa8;
  String *in_stack_ffffffffffffffb0;
  
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffffb0,in_RSI);
  std::locale::locale((locale *)&stack0xffffffffffffffa8);
  sf::String::String(in_stack_ffffffffffffffb0,(string *)in_stack_ffffffffffffffa8,
                     in_stack_ffffffffffffffa0);
  sf::Text::setString(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  sf::String::~String((String *)0x1a9265);
  std::locale::~locale((locale *)&stack0xffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  piVar1 = (int *)(in_RDI + 0x64c);
  local_68[0] = std::__cxx11::string::length();
  piVar1 = std::min<int>(piVar1,local_68);
  *(int *)(in_RDI + 0x648) = *piVar1;
  VVar2 = sf::Text::findCharacterPos(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  local_70 = VVar2.x;
  sf::Transformable::setPosition((Transformable *)(in_RDI + 0x4f8),local_70,2.0);
  return;
}

Assistant:

void TextField::setString(const string& s) {
    field.setString(s.substr(0, maxCharacters));
    caretPosition = min(maxCharacters, static_cast<int>(s.length()));
    caret.setPosition(field.findCharacterPos(caretPosition).x, 2.0f);
}